

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

int file_skip(output_file *out,int64_t cnt)

{
  FILE *__stream;
  __off64_t _Var1;
  int *piVar2;
  char *pcVar3;
  __off64_t in_RSI;
  long in_RDI;
  output_file_normal *outn;
  off64_t ret;
  int local_4;
  
  _Var1 = lseek64(*(int *)(in_RDI + 0x48),in_RSI,1);
  __stream = _stderr;
  if (_Var1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"error: %s: lseek64: %s\n","file_skip",pcVar3);
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int file_skip(struct output_file* out, int64_t cnt) {
  off64_t ret;
  struct output_file_normal* outn = to_output_file_normal(out);

  ret = lseek64(outn->fd, cnt, SEEK_CUR);
  if (ret < 0) {
    error_errno("lseek64");
    return -1;
  }
  return 0;
}